

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Plink_copy(plink **to,plink *from)

{
  plink *ppVar1;
  plink *ppVar2;
  
  if (from != (plink *)0x0) {
    ppVar2 = *to;
    do {
      ppVar1 = from->next;
      from->next = ppVar2;
      *to = from;
      ppVar2 = from;
      from = ppVar1;
    } while (ppVar1 != (plink *)0x0);
  }
  return;
}

Assistant:

void Plink_copy(struct plink **to, struct plink *from)
{
  struct plink *nextpl;
  while( from ){
    nextpl = from->next;
    from->next = *to;
    *to = from;
    from = nextpl;
  }
}